

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECDH.cpp
# Opt level: O0

bool __thiscall
OSSLECDH::reconstructPrivateKey(OSSLECDH *this,PrivateKey **ppPrivateKey,ByteString *serialisedData)

{
  size_t sVar1;
  long *plVar2;
  ulong uVar3;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  OSSLECPrivateKey *priv;
  OSSLECPrivateKey *in_stack_ffffffffffffffd0;
  
  if ((in_RSI != (undefined8 *)0x0) &&
     (sVar1 = ByteString::size((ByteString *)0x1b3595), sVar1 != 0)) {
    plVar2 = (long *)operator_new(0x60);
    OSSLECPrivateKey::OSSLECPrivateKey(in_stack_ffffffffffffffd0);
    uVar3 = (**(code **)(*plVar2 + 0x68))(plVar2,in_RDX);
    if ((uVar3 & 1) == 0) {
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x10))();
      }
      return false;
    }
    *in_RSI = plVar2;
    return true;
  }
  return false;
}

Assistant:

bool OSSLECDH::reconstructPrivateKey(PrivateKey** ppPrivateKey, ByteString& serialisedData)
{
	// Check input
	if ((ppPrivateKey == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	OSSLECPrivateKey* priv = new OSSLECPrivateKey();

	if (!priv->deserialise(serialisedData))
	{
		delete priv;

		return false;
	}

	*ppPrivateKey = priv;

	return true;
}